

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegionPrivate * qt_bitmapToRegion(QBitmap *bitmap)

{
  byte bVar1;
  Format FVar2;
  int iVar3;
  QRegionPrivate *source;
  uchar *puVar4;
  Representation RVar5;
  int iVar6;
  int iVar7;
  Representation RVar8;
  uint uVar9;
  byte bVar10;
  Representation i;
  long in_FS_OFFSET;
  bool bVar11;
  QRect local_68;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage((QImage *)local_58,&bitmap->super_QPixmap);
  source = (QRegionPrivate *)operator_new(0x40);
  source->numRects = 0;
  source->innerArea = -1;
  (source->rects).d.d = (Data *)0x0;
  (source->rects).d.ptr = (QRect *)0x0;
  (source->rects).d.size = 0;
  (source->extents).x1 = 0;
  (source->extents).y1 = 0;
  (source->extents).x2 = -1;
  (source->extents).y2 = -1;
  (source->innerRect).x1 = 0;
  (source->innerRect).y1 = 0;
  (source->innerRect).x2 = -1;
  (source->innerRect).y2 = -1;
  local_68.x1.m_i = 0;
  local_68.y1.m_i = 0;
  local_68.x2.m_i = -1;
  local_68.y2.m_i = -1;
  FVar2 = QImage::format((QImage *)local_58);
  iVar3 = QImage::height((QImage *)local_58);
  if (0 < iVar3) {
    i.m_i = 0;
    do {
      puVar4 = QImage::constScanLine((QImage *)local_58,i.m_i);
      iVar3 = QImage::width((QImage *)local_58);
      if (iVar3 < 1) {
        bVar11 = true;
        RVar8.m_i = -1;
        RVar5.m_i = -1;
      }
      else {
        bVar1 = 0;
        RVar5.m_i = -1;
        iVar7 = 0;
        do {
          iVar6 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar6 = iVar7;
          }
          bVar10 = puVar4[iVar6 >> 3];
          if ((iVar3 + -8 < iVar7) || (bVar10 != bVar1)) {
            if (FVar2 == Format_MonoLSB) {
              if (iVar7 < iVar3) {
                uVar9 = 8;
                RVar8.m_i = RVar5.m_i;
                do {
                  RVar5.m_i = RVar8.m_i;
                  if (((bVar1 != 0) != (bool)(bVar10 & 1)) &&
                     (bVar11 = bVar1 != 0, bVar1 = 0xff, RVar5.m_i = iVar7, bVar11)) {
                    local_68.y1.m_i = i.m_i;
                    local_68.x1.m_i = RVar8.m_i;
                    local_68.y2.m_i = i.m_i;
                    local_68.x2.m_i = iVar7 + -1;
                    UnionRectWithRegion(&local_68,source,source);
                    bVar1 = 0;
                    RVar5.m_i = RVar8.m_i;
                  }
                  iVar7 = iVar7 + 1;
                  if (uVar9 < 2) break;
                  bVar10 = bVar10 >> 1;
                  uVar9 = uVar9 - 1;
                  RVar8.m_i = RVar5.m_i;
                } while (iVar7 < iVar3);
              }
            }
            else if (iVar7 < iVar3) {
              uVar9 = 8;
              RVar8.m_i = RVar5.m_i;
              do {
                RVar5.m_i = RVar8.m_i;
                if (((bVar1 != 0) == -1 < (char)bVar10) &&
                   (bVar11 = bVar1 != 0, bVar1 = 0xff, RVar5.m_i = iVar7, bVar11)) {
                  local_68.y1.m_i = i.m_i;
                  local_68.x1.m_i = RVar8.m_i;
                  local_68.y2.m_i = i.m_i;
                  local_68.x2.m_i = iVar7 + -1;
                  UnionRectWithRegion(&local_68,source,source);
                  bVar1 = 0;
                  RVar5.m_i = RVar8.m_i;
                }
                iVar7 = iVar7 + 1;
                if (uVar9 < 2) break;
                bVar10 = bVar10 * '\x02';
                uVar9 = uVar9 - 1;
                RVar8.m_i = RVar5.m_i;
              } while (iVar7 < iVar3);
            }
          }
          else {
            iVar7 = iVar7 + 8;
          }
        } while (iVar7 < iVar3);
        bVar11 = bVar1 == 0;
        RVar8.m_i = iVar7 + -1;
      }
      if (!bVar11) {
        local_68.y1.m_i = i.m_i;
        local_68.x1.m_i = RVar5.m_i;
        local_68.y2.m_i = i.m_i;
        local_68.x2.m_i = RVar8.m_i;
        UnionRectWithRegion(&local_68,source,source);
      }
      i.m_i = i.m_i + 1;
      iVar3 = QImage::height((QImage *)local_58);
    } while (i.m_i < iVar3);
  }
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return source;
}

Assistant:

QRegionPrivate *qt_bitmapToRegion(const QBitmap& bitmap)
{
    const QImage image = bitmap.toImage();

    QRegionPrivate *region = new QRegionPrivate;

    QRect xr;

#define AddSpan \
        { \
            xr.setCoords(prev1, y, x-1, y); \
            UnionRectWithRegion(&xr, region, *region); \
        }

    const uchar zero = 0;
    bool little = image.format() == QImage::Format_MonoLSB;

    int x,
        y;
    for (y = 0; y < image.height(); ++y) {
        const uchar *line = image.constScanLine(y);
        int w = image.width();
        uchar all = zero;
        int prev1 = -1;
        for (x = 0; x < w;) {
            uchar byte = line[x / 8];
            if (x > w - 8 || byte!=all) {
                if (little) {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x01) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all!=zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte >>= 1;
                        ++x;
                    }
                } else {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x80) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all != zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte <<= 1;
                        ++x;
                    }
                }
            } else {
                x += 8;
            }
        }
        if (all != zero) {
            AddSpan
        }
    }
#undef AddSpan

    return region;
}